

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_thread_result ma_device_thread__null(void *pData)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  timespec newTime;
  timespec local_40;
  
  if (pData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x2457,"ma_thread_result ma_device_thread__null(void *)");
  }
  lVar1 = (long)pData + 0x53f0;
switchD_00111796_default:
  ma_event_wait((ma_event *)((long)pData + 0x5380));
  switch(*(undefined4 *)((long)pData + 0x5450)) {
  case 0:
    goto switchD_00111796_caseD_0;
  case 1:
    LOCK();
    *(undefined4 *)((long)pData + 0x5450) = 0;
    UNLOCK();
    clock_gettime(1,&local_40);
    *(__time_t *)((long)pData + 0x5458) = local_40.tv_sec * 1000000000 + local_40.tv_nsec;
    uVar2 = *(uint *)((long)pData + 0x5450);
    while (1 < uVar2) {
      local_40.tv_sec = 0;
      local_40.tv_nsec = 10000000;
      nanosleep(&local_40,(timespec *)0x0);
      uVar2 = *(uint *)((long)pData + 0x5450);
    }
    break;
  case 2:
    LOCK();
    *(undefined4 *)((long)pData + 0x5450) = 0;
    UNLOCK();
    clock_gettime(1,&local_40);
    lVar3 = (local_40.tv_sec * 1000000000 + local_40.tv_nsec) - *(long *)((long)pData + 0x5458);
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    *(double *)((long)pData + 0x5460) =
         ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000000.0 +
         *(double *)((long)pData + 0x5460);
    clock_gettime(1,&local_40);
    *(__time_t *)((long)pData + 0x5458) = local_40.tv_sec * 1000000000 + local_40.tv_nsec;
    break;
  case 3:
    LOCK();
    *(undefined4 *)((long)pData + 0x5450) = 0;
    UNLOCK();
    LOCK();
    *(undefined4 *)((long)pData + 0x5454) = 0;
    UNLOCK();
    if (*(long *)((long)pData + 0x53e8) != 0) {
      (**(code **)(*(long *)((long)pData + 0x53e8) + 0x328))(lVar1);
      *(undefined4 *)((long)pData + 0x5448) = 1;
      (**(code **)(*(long *)((long)pData + 0x53e8) + 0x350))((long)pData + 0x5418);
      (**(code **)(*(long *)((long)pData + 0x53e8) + 0x330))(lVar1);
    }
    return (ma_thread_result)0x0;
  default:
    goto switchD_00111796_default;
  }
  LOCK();
  *(undefined4 *)((long)pData + 0x5454) = 0;
  UNLOCK();
  if (*(long *)((long)pData + 0x53e8) != 0) {
    (**(code **)(*(long *)((long)pData + 0x53e8) + 0x328))(lVar1);
    *(undefined4 *)((long)pData + 0x5448) = 1;
    (**(code **)(*(long *)((long)pData + 0x53e8) + 0x350))((long)pData + 0x5418);
    (**(code **)(*(long *)((long)pData + 0x53e8) + 0x330))(lVar1);
  }
  goto switchD_00111796_default;
switchD_00111796_caseD_0:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x2489,"ma_thread_result ma_device_thread__null(void *)");
}

Assistant:

static ma_thread_result MA_THREADCALL ma_device_thread__null(void* pData)
{
    ma_device* pDevice = (ma_device*)pData;
    MA_ASSERT(pDevice != NULL);

    for (;;) {  /* Keep the thread alive until the device is uninitialized. */
        /* Wait for an operation to be requested. */
        ma_event_wait(&pDevice->null_device.operationEvent);

        /* At this point an event should have been triggered. */

        /* Starting the device needs to put the thread into a loop. */
        if (pDevice->null_device.operation == MA_DEVICE_OP_START__NULL) {
            ma_atomic_exchange_32(&pDevice->null_device.operation, MA_DEVICE_OP_NONE__NULL);

            /* Reset the timer just in case. */
            ma_timer_init(&pDevice->null_device.timer);

            /* Keep looping until an operation has been requested. */
            while (pDevice->null_device.operation != MA_DEVICE_OP_NONE__NULL && pDevice->null_device.operation != MA_DEVICE_OP_START__NULL) {
                ma_sleep(10); /* Don't hog the CPU. */
            }

            /* Getting here means a suspend or kill operation has been requested. */
            ma_atomic_exchange_32(&pDevice->null_device.operationResult, MA_SUCCESS);
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            continue;
        }

        /* Suspending the device means we need to stop the timer and just continue the loop. */
        if (pDevice->null_device.operation == MA_DEVICE_OP_SUSPEND__NULL) {
            ma_atomic_exchange_32(&pDevice->null_device.operation, MA_DEVICE_OP_NONE__NULL);

            /* We need to add the current run time to the prior run time, then reset the timer. */
            pDevice->null_device.priorRunTime += ma_timer_get_time_in_seconds(&pDevice->null_device.timer);
            ma_timer_init(&pDevice->null_device.timer);

            /* We're done. */
            ma_atomic_exchange_32(&pDevice->null_device.operationResult, MA_SUCCESS);
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            continue;
        }

        /* Killing the device means we need to get out of this loop so that this thread can terminate. */
        if (pDevice->null_device.operation == MA_DEVICE_OP_KILL__NULL) {
            ma_atomic_exchange_32(&pDevice->null_device.operation, MA_DEVICE_OP_NONE__NULL);
            ma_atomic_exchange_32(&pDevice->null_device.operationResult, MA_SUCCESS);
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            break;
        }

        /* Getting a signal on a "none" operation probably means an error. Return invalid operation. */
        if (pDevice->null_device.operation == MA_DEVICE_OP_NONE__NULL) {
            MA_ASSERT(MA_FALSE);  /* <-- Trigger this in debug mode to ensure developers are aware they're doing something wrong (or there's a bug in a miniaudio). */
            ma_atomic_exchange_32(&pDevice->null_device.operationResult, MA_INVALID_OPERATION);
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            continue;   /* Continue the loop. Don't terminate. */
        }
    }

    return (ma_thread_result)0;
}